

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.cpp
# Opt level: O2

void __thiscall lsim::Simulator::pin_set_default(Simulator *this,pin_t pin,Value value)

{
  pointer puVar1;
  
  puVar1 = (this->m_pin_nodes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((ulong)pin <
      (ulong)((long)(this->m_pin_nodes).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar1 >> 2)) {
    node_set_default(this,puVar1[pin],value);
    return;
  }
  __assert_fail("pin < m_pin_nodes.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/simulator.cpp"
                ,0x46,"void lsim::Simulator::pin_set_default(pin_t, Value)");
}

Assistant:

void Simulator::pin_set_default(pin_t pin, Value value) {
    assert(pin < m_pin_nodes.size());

    auto node_id = m_pin_nodes[pin];
    node_set_default(node_id, value);
}